

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O2

void CollectMergedSet(VmInstruction *inst,uint marker,SmallArray<VmInstruction_*,_32U> *mergedSet)

{
  VmValue *pVVar1;
  VmInstruction *pVVar2;
  VmInstructionType VVar3;
  VmValue **ppVVar4;
  VmInstruction *pVVar5;
  VmInstruction *pVVar6;
  VmValueType index;
  uint index_00;
  uint argument;
  uint uVar7;
  VmInstruction *local_38;
  
  if (inst->marker == 0) {
    local_38 = inst;
    SmallArray<VmInstruction_*,_32U>::push_back(mergedSet,&local_38);
    local_38->marker = marker;
    VVar3 = local_38->cmd;
    if (VVar3 == VM_INST_PHI) {
      for (uVar7 = 0; uVar7 < (local_38->arguments).count; uVar7 = uVar7 + 2) {
        ppVVar4 = SmallArray<VmValue_*,_4U>::operator[](&local_38->arguments,uVar7);
        pVVar6 = (VmInstruction *)*ppVVar4;
        if ((pVVar6 == (VmInstruction *)0x0) || ((pVVar6->super_VmValue).typeID != 2)) {
          pVVar6 = (VmInstruction *)0x0;
        }
        CollectMergedSet(pVVar6,marker,mergedSet);
      }
      VVar3 = local_38->cmd;
    }
    if (VVar3 == VM_INST_MOV) {
      ppVVar4 = SmallArray<VmValue_*,_4U>::operator[](&local_38->arguments,0);
      pVVar6 = (VmInstruction *)*ppVVar4;
      if ((pVVar6 == (VmInstruction *)0x0) || ((pVVar6->super_VmValue).typeID != 2)) {
        pVVar6 = (VmInstruction *)0x0;
      }
      CollectMergedSet(pVVar6,marker,mergedSet);
      VVar3 = local_38->cmd;
    }
    if (VVar3 == VM_INST_DEF) {
      for (uVar7 = 0; uVar7 < (local_38->super_VmValue).users.count; uVar7 = uVar7 + 1) {
        ppVVar4 = SmallArray<VmValue_*,_8U>::operator[](&(local_38->super_VmValue).users,uVar7);
        pVVar1 = *ppVVar4;
        if (((pVVar1 != (VmValue *)0x0) && (pVVar1->typeID == 2)) &&
           (*(int *)&pVVar1[1]._vptr_VmValue == 0x51)) {
          for (index = VM_TYPE_VOID; index < pVVar1[1].type.type; index = index + VM_TYPE_DOUBLE) {
            ppVVar4 = SmallArray<VmValue_*,_4U>::operator[]
                                ((SmallArray<VmValue_*,_4U> *)&pVVar1[1].typeID,index);
            pVVar6 = (VmInstruction *)*ppVVar4;
            if ((pVVar6 == (VmInstruction *)0x0) || ((pVVar6->super_VmValue).typeID != 2)) {
              pVVar6 = (VmInstruction *)0x0;
            }
            ppVVar4 = SmallArray<VmValue_*,_4U>::operator[]
                                ((SmallArray<VmValue_*,_4U> *)&pVVar1[1].typeID,index + VM_TYPE_INT)
            ;
            pVVar5 = (VmInstruction *)*ppVVar4;
            if ((pVVar5 == (VmInstruction *)0x0) || ((pVVar5->super_VmValue).typeID != 2)) {
              if (pVVar6 != (VmInstruction *)0x0) {
                __assert_fail("source",
                              "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                              ,0x1c47,
                              "void CollectMergedSet(VmInstruction *, unsigned int, SmallArray<VmInstruction *, 32> &)"
                             );
              }
LAB_0025aa52:
              __assert_fail("destination",
                            "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                            ,0x1c46,
                            "void CollectMergedSet(VmInstruction *, unsigned int, SmallArray<VmInstruction *, 32> &)"
                           );
            }
            if (pVVar6 == (VmInstruction *)0x0) goto LAB_0025aa52;
            if (local_38 == pVVar6) {
              CollectMergedSet(pVVar5,marker,mergedSet);
            }
          }
        }
      }
    }
    for (uVar7 = 0; uVar7 < (local_38->super_VmValue).users.count; uVar7 = uVar7 + 1) {
      ppVVar4 = SmallArray<VmValue_*,_8U>::operator[](&(local_38->super_VmValue).users,uVar7);
      pVVar6 = (VmInstruction *)*ppVVar4;
      if ((pVVar6 == (VmInstruction *)0x0) || ((pVVar6->super_VmValue).typeID != 2)) {
        pVVar6 = (VmInstruction *)0x0;
      }
      VVar3 = pVVar6->cmd;
      if (VVar3 == VM_INST_PHI) {
        CollectMergedSet(pVVar6,marker,mergedSet);
        VVar3 = pVVar6->cmd;
      }
      if (VVar3 == VM_INST_MOV) {
        CollectMergedSet(pVVar6,marker,mergedSet);
        VVar3 = pVVar6->cmd;
      }
      if (VVar3 == VM_INST_PARALLEL_COPY) {
        for (index_00 = 0; index_00 < (pVVar6->arguments).count; index_00 = index_00 + 2) {
          ppVVar4 = SmallArray<VmValue_*,_4U>::operator[](&pVVar6->arguments,index_00);
          pVVar5 = (VmInstruction *)*ppVVar4;
          if ((pVVar5 == (VmInstruction *)0x0) || ((pVVar5->super_VmValue).typeID != 2)) {
            pVVar5 = (VmInstruction *)0x0;
          }
          ppVVar4 = SmallArray<VmValue_*,_4U>::operator[](&pVVar6->arguments,index_00 + 1);
          pVVar2 = (VmInstruction *)*ppVVar4;
          if ((pVVar2 == (VmInstruction *)0x0) || ((pVVar2->super_VmValue).typeID != 2)) {
            if (pVVar5 != (VmInstruction *)0x0) {
              __assert_fail("source",
                            "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                            ,0x1c62,
                            "void CollectMergedSet(VmInstruction *, unsigned int, SmallArray<VmInstruction *, 32> &)"
                           );
            }
LAB_0025aa0f:
            __assert_fail("destination",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                          ,0x1c61,
                          "void CollectMergedSet(VmInstruction *, unsigned int, SmallArray<VmInstruction *, 32> &)"
                         );
          }
          if (pVVar5 == (VmInstruction *)0x0) goto LAB_0025aa0f;
          if (local_38 == pVVar2) {
            CollectMergedSet(pVVar5,marker,mergedSet);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void CollectMergedSet(VmInstruction *inst, unsigned marker, SmallArray<VmInstruction*, 32> &mergedSet)
{
	if(inst->marker != 0)
		return;

	mergedSet.push_back(inst);

	inst->marker = marker;

	if(inst->cmd == VM_INST_PHI)
	{
		for(unsigned argument = 0; argument < inst->arguments.size(); argument += 2)
		{
			VmInstruction *instruction = getType<VmInstruction>(inst->arguments[argument]);

			CollectMergedSet(instruction, marker, mergedSet);
		}
	}

	if(inst->cmd == VM_INST_MOV)
	{
		VmInstruction *instruction = getType<VmInstruction>(inst->arguments[0]);

		CollectMergedSet(instruction, marker, mergedSet);
	}

	if(inst->cmd == VM_INST_DEF)
	{
		for(unsigned userPos = 0; userPos < inst->users.size(); userPos++)
		{
			VmInstruction *instruction = getType<VmInstruction>(inst->users[userPos]);

			if(instruction && instruction->cmd == VM_INST_PARALLEL_COPY)
			{
				for(unsigned argumentPos = 0; argumentPos < instruction->arguments.size(); argumentPos += 2)
				{
					VmInstruction *destination = getType<VmInstruction>(instruction->arguments[argumentPos]);
					VmInstruction *source = getType<VmInstruction>(instruction->arguments[argumentPos + 1]);

					assert(destination);
					assert(source);

					if(inst == destination)
						CollectMergedSet(source, marker, mergedSet);
				}
			}
		}
	}

	for(unsigned userPos = 0; userPos < inst->users.size(); userPos++)
	{
		VmInstruction *instruction = getType<VmInstruction>(inst->users[userPos]);

		if(instruction->cmd == VM_INST_PHI)
			CollectMergedSet(instruction, marker, mergedSet);

		if(instruction->cmd == VM_INST_MOV)
			CollectMergedSet(instruction, marker, mergedSet);

		if(instruction->cmd == VM_INST_PARALLEL_COPY)
		{
			for(unsigned argumentPos = 0; argumentPos < instruction->arguments.size(); argumentPos += 2)
			{
				VmInstruction *destination = getType<VmInstruction>(instruction->arguments[argumentPos]);
				VmInstruction *source = getType<VmInstruction>(instruction->arguments[argumentPos + 1]);

				assert(destination);
				assert(source);

				if(inst == source)
					CollectMergedSet(destination, marker, mergedSet);
			}
		}
	}
}